

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

MatcherDescriberInterface *
testing::internal::
MatcherBase<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>const&>
::
GetDescriberImpl<testing::internal::MatcherBase<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>const&>::ValuePolicy<testing::MatcherInterface<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>const&>const*,true>>
          (MatcherBase<const_phmap::parallel_flat_hash_map<unsigned_long,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_4UL,_std::mutex>_&>
           *m)

{
  return *(MatcherDescriberInterface **)((m->buffer_).i + 8);
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }